

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_node_counts
          (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,node_type_counter_array *expected_node_counts)

{
  char *message;
  stringstream local_220 [8];
  stringstream dump_sink;
  ostream local_210 [112];
  ios_base local_1a0 [264];
  undefined1 local_98 [8];
  node_type_counter_array actual_node_counts;
  long local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  char local_28 [8];
  AssertionResult gtest_ar;
  
  std::__cxx11::stringstream::stringstream(local_220);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
            (&this->test_db,local_210);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((node_type_counter_array *)local_98,&this->test_db);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)
             (actual_node_counts._M_elems + 4),expected_node_counts->_M_elems,
             expected_node_counts[1]._M_elems,(allocator_type *)&local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (actual_node_counts._M_elems + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58,&local_40);
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_28,(char *)&local_58,(array<unsigned_long,_5UL> *)"(actual_node_counts)");
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (actual_node_counts._M_elems[4] != 0) {
    operator_delete((void *)actual_node_counts._M_elems[4],local_60 - actual_node_counts._M_elems[4]
                   );
  }
  if (local_28[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2bf,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  std::__cxx11::stringstream::~stringstream(local_220);
  std::ios_base::~ios_base(local_1a0);
  return;
}

Assistant:

void assert_node_counts(
      const node_type_counter_array &expected_node_counts) const {
    // Dump the tree to a string. Do not attempt to check the dump format, only
    // that dumping does not crash
    std::stringstream dump_sink;
    test_db.dump(dump_sink);

    const auto actual_node_counts = test_db.get_node_counts();
    UNODB_ASSERT_THAT(actual_node_counts,
                      ::testing::ElementsAreArray(expected_node_counts));
  }